

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O0

int IDASetQuadErrCon(void *ida_mem,int errconQ)

{
  undefined4 in_ESI;
  long in_RDI;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x37d,"IDASetQuadErrCon",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (*(int *)(in_RDI + 0x6a8) == 0) {
    IDAProcessError((IDAMem)0x0,-0x1e,900,"IDASetQuadErrCon",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"Illegal attempt to call before calling IDAQuadInit.");
    local_4 = -0x1e;
  }
  else {
    *(undefined4 *)(in_RDI + 0x78) = in_ESI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDASetQuadErrCon(void* ida_mem, sunbooleantype errconQ)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_quadMallocDone == SUNFALSE)
  {
    IDAProcessError(NULL, IDA_NO_QUAD, __LINE__, __func__, __FILE__, MSG_NO_QUAD);
    return (IDA_NO_QUAD);
  }

  IDA_mem->ida_errconQ = errconQ;

  return (IDA_SUCCESS);
}